

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O0

double __thiscall CCIT<UF>::Alloc(CCIT<UF> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  PerformanceEvaluator *perf;
  double dVar4;
  double dVar5;
  double ma_t;
  double t;
  Size local_80;
  Mat_<int> local_78;
  double local_18;
  double ls_t;
  CCIT<UF> *this_local;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  local_18 = UF::Alloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) *
                       ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1,perf);
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar4 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar5 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return local_18 + (dVar4 - dVar5);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ls_t + ma_t;
    }